

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_list.c
# Opt level: O0

void opj_procedure_list_destroy(opj_procedure_list_t *p_list)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void  opj_procedure_list_destroy(opj_procedure_list_t * p_list)
{
	if
		(! p_list)
	{
		return;
	}
	/* initialization */
	if
		(p_list->m_procedures)
	{
		opj_free(p_list->m_procedures);
	}
	opj_free(p_list);
}